

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::OneofDescriptorProto::Serialize(OneofDescriptorProto *this,Message *msg)

{
  _Head_base<0UL,_perfetto::protos::gen::OneofOptions_*,_false> _Var1;
  uint8_t *puVar2;
  Message *this_00;
  
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 2) != 0) {
    protozero::Message::AppendBytes
              (msg,1,(this->name_)._M_dataplus._M_p,(this->name_)._M_string_length);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 4) != 0) {
    _Var1._M_head_impl =
         (this->options_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::OneofOptions,_std::default_delete<perfetto::protos::gen::OneofOptions>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::OneofOptions_*,_std::default_delete<perfetto::protos::gen::OneofOptions>_>
         .super__Head_base<0UL,_perfetto::protos::gen::OneofOptions_*,_false>._M_head_impl;
    this_00 = protozero::Message::BeginNestedMessageInternal(msg,2);
    puVar2 = *(uint8_t **)&((_Var1._M_head_impl)->unknown_fields_)._M_dataplus;
    protozero::Message::WriteToStream
              (this_00,puVar2,
               puVar2 + *(size_type *)((long)&(_Var1._M_head_impl)->unknown_fields_ + 8));
  }
  puVar2 = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream(msg,puVar2,puVar2 + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void OneofDescriptorProto::Serialize(::protozero::Message* msg) const {
  // Field 1: name
  if (_has_field_[1]) {
    msg->AppendString(1, name_);
  }

  // Field 2: options
  if (_has_field_[2]) {
    (*options_).Serialize(msg->BeginNestedMessage<::protozero::Message>(2));
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}